

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syrk.hpp
# Opt level: O3

void remora::bindings::
     syrk_impl<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (ulong *e,long *m,undefined8 *alpha)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  size_t stride1;
  pointer __ptr;
  pointer __ptr_00;
  pointer __ptr_01;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  pointer pdVar10;
  double *pdVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  aligned_allocator<double,_64UL> allocatorM;
  aligned_allocator<double,_64UL> allocatorE;
  ulong local_d0;
  type E_rights_trans;
  type E_lefts;
  
  __ptr = boost::alignment::aligned_allocator<double,_64UL>::allocate
                    (&allocatorE,0x18000,(const_void_pointer)0x0);
  __ptr_00 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocatorE,0x18000,(const_void_pointer)0x0);
  __ptr_01 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocatorM,0x2400,(const_void_pointer)0x0);
  uVar1 = *e;
  uVar2 = e[1];
  uVar6 = uVar2 + 0x3ff;
  if (0x3ff < uVar6) {
    lVar3 = *m;
    pdVar4 = (double *)m[2];
    uVar9 = 0;
    do {
      uVar23 = uVar2 + uVar9 * -0x400;
      if (0x3ff < uVar23) {
        uVar23 = 0x400;
      }
      if (0x5f < uVar1 + 0x5f) {
        local_d0 = 1;
        uVar16 = 0;
        pdVar7 = pdVar4;
        uVar12 = uVar1;
        do {
          uVar17 = 0x60;
          if (uVar12 < 0x60) {
            uVar17 = uVar12;
          }
          uVar5 = uVar16 * 0x60;
          uVar22 = uVar1 + uVar16 * -0x60;
          if (0x5f < uVar22) {
            uVar22 = 0x60;
          }
          E_lefts.m_leading_dimension = e[1];
          E_lefts.m_values =
               (double *)(E_lefts.m_leading_dimension * uVar5 * 8 + e[2] + uVar9 * 0x2000);
          E_lefts.m_size1 = uVar22;
          E_lefts.m_size2 = uVar23;
          pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::syrk_block_size<double>>
                    (&E_lefts,__ptr);
          uVar20 = 0;
          pdVar13 = pdVar7;
          do {
            uVar15 = uVar20 * 0x60;
            uVar14 = uVar1 + uVar20 * -0x60;
            if (0x5f < uVar14) {
              uVar14 = 0x60;
            }
            E_rights_trans.m_leading_dimension = e[1];
            E_rights_trans.m_values =
                 (double *)(E_rights_trans.m_leading_dimension * uVar15 * 8 + e[2] + uVar9 * 0x2000)
            ;
            E_rights_trans.m_size1 = uVar23;
            E_rights_trans.m_size2 = uVar14;
            pack_B_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::syrk_block_size<double>>
                      (&E_rights_trans);
            if (uVar16 == uVar20) {
              if (uVar1 == uVar5) {
                mgemm<double,double,remora::bindings::syrk_block_size<double>>
                          (*alpha,uVar22,uVar14,uVar23,__ptr,__ptr_00,__ptr_01,0x60,1);
              }
              else {
                uVar21 = uVar17;
                pdVar10 = __ptr_01;
                do {
                  if (uVar1 != uVar15) {
                    memset(pdVar10,0,(ulong)(uint)((int)uVar14 * 8));
                  }
                  pdVar10 = pdVar10 + 0x60;
                  uVar21 = uVar21 - 1;
                } while (uVar21 != 0);
                mgemm<double,double,remora::bindings::syrk_block_size<double>>
                          (*alpha,uVar22,uVar14,uVar23,__ptr,__ptr_00,__ptr_01,0x60,1);
                if (uVar1 != uVar5) {
                  lVar8 = 1;
                  uVar15 = 0;
                  pdVar10 = __ptr_01;
                  pdVar11 = pdVar13;
                  do {
                    uVar15 = uVar15 + 1;
                    if (uVar15 != 0) {
                      lVar19 = 0;
                      pdVar18 = pdVar11;
                      do {
                        *pdVar18 = pdVar10[lVar19] + *pdVar18;
                        lVar19 = lVar19 + 1;
                        pdVar18 = pdVar18 + lVar3;
                      } while (lVar8 != lVar19);
                    }
                    lVar8 = lVar8 + 1;
                    pdVar11 = pdVar11 + 1;
                    pdVar10 = pdVar10 + 0x60;
                  } while (uVar15 != uVar22);
                }
              }
            }
            else {
              mgemm<double,double,remora::bindings::syrk_block_size<double>>
                        (*alpha,uVar22,uVar14,uVar23,__ptr,__ptr_00,
                         pdVar4 + uVar16 * 0x60 + uVar15 * lVar3,1,lVar3);
            }
            uVar20 = uVar20 + 1;
            pdVar13 = pdVar13 + lVar3 * 0x60;
          } while (uVar20 != local_d0);
          uVar16 = uVar16 + 1;
          local_d0 = local_d0 + 1;
          uVar12 = uVar12 - 0x60;
          pdVar7 = pdVar7 + 0x60;
        } while (uVar16 != (uVar1 + 0x5f) / 0x60);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar6 >> 10);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void syrk_impl(
	matrix_expression<E, cpu_tag> const& e,
	matrix_expression<Mat, cpu_tag>& m,
	typename Mat::value_type& alpha,
	Triangular t
){
	typedef typename E::value_type value_type;
	typedef syrk_block_size<value_type> block_size;

	static const std::size_t MC = block_size::lhs_block_size;
	static const std::size_t EC = block_size::rhs_k_size;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocatorE;
	boost::alignment::aligned_allocator<typename Mat::value_type,block_size::block::align> allocatorM;
	value_type* E_left = allocatorE.allocate(MC * EC);
	value_type* E_right = allocatorE.allocate(MC * EC);
	auto M_diagonal_block = allocatorM.allocate(MC * MC);

	//figure out number of blocks to use
	const std::size_t  M = e().size1();
	const std::size_t  K = e().size2();
	const std::size_t Mb = (M+MC-1) / MC;//we split m in Mb x Mb blocks
	const std::size_t Eb = (K+EC-1) / EC;//we split B in Mb x Eb blocks

	//get access to raw storage of M
	auto storageM = m().raw_storage();
	auto Mpointer = storageM.values;
	const std::size_t stride1 = Mat::orientation::index_M(storageM.leading_dimension,1);
	const std::size_t stride2 = Mat::orientation::index_m(storageM.leading_dimension,1);

	for (std::size_t k = 0; k < Eb; ++k) {//column blocks of E
		std::size_t kc = std::min(EC, K - k * EC);
		for (std::size_t i = 0; i < Mb; ++i){//row-blocks of M
			std::size_t mc = std::min(MC, M - i * MC);
			//load block of the left E into memory
			auto E_lefts = subrange(e, i * MC, i * MC + mc, k*EC, k*EC + kc );
			pack_A_dense(E_lefts, E_left, block_size());

			std::size_t start_j = Triangular::is_upper? i : 0;
			std::size_t end_j = Triangular::is_upper? Mb : i+1;
			for(std::size_t j = start_j; j < end_j; ++j){//traverse over the blocks that are to be computed
				std::size_t mc2 = std::min(MC, M - j * MC);
				//load block of the right E into memory
				auto E_rights = subrange(e, j * MC, j * MC + mc2, k*EC, k*EC + kc );
				auto E_rights_trans = trans(E_rights);
				pack_B_dense(E_rights_trans, E_right, block_size());

				if(i==j){//diagonal block: we have to ensure that we only access elements on the diagonal
					for(std::size_t i0 = 0; i0 != mc; ++i0){
						for(std::size_t j0 = 0; j0 != mc2; ++j0){
							M_diagonal_block[i0*MC+j0] = 0.0;
						}
					}
					mgemm(
						mc, mc2, kc, alpha, E_left, E_right,
						M_diagonal_block, MC, 1, block_size()
					);
					auto M_diagonal = Mpointer + i * MC * stride1 + j * MC * stride2;
					for(std::size_t i0 = 0; i0 != mc; ++i0){
						std::size_t start_j0 = Triangular::is_upper? i0 : 0;
						std::size_t end_j0 = Triangular::is_upper? mc2 : i0+1;
						for(std::size_t j0 = start_j0; j0 < end_j0; ++j0){
							M_diagonal[i0*stride1+j0*stride2] += M_diagonal_block[i0*MC+j0];
						}
					}
				}else{
					mgemm(
						mc, mc2, kc, alpha, E_left, E_right,
						&Mpointer[i*MC * stride1 + j*MC * stride2], stride1, stride2, block_size()
					);
				}
			}
		}
	}
	//free storage
	allocatorE.deallocate(E_left,MC * EC);
	allocatorE.deallocate(E_right,MC * EC);
	allocatorM.deallocate(M_diagonal_block, MC * MC);
}